

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_predicate_push_promise_send(nghttp2_session *session,nghttp2_stream *stream)

{
  int rv;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  if (session->server == '\0') {
    session_local._4_4_ = -0x1f9;
  }
  else {
    session_local._4_4_ = session_predicate_for_stream_send(session,stream);
    if (session_local._4_4_ == 0) {
      if (stream == (nghttp2_stream *)0x0) {
        __assert_fail("stream",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x7d5,
                      "int session_predicate_push_promise_send(nghttp2_session *, nghttp2_stream *)"
                     );
      }
      if ((session->remote_settings).enable_push == 0) {
        session_local._4_4_ = -0x210;
      }
      else if (stream->state == NGHTTP2_STREAM_CLOSING) {
        session_local._4_4_ = -0x1ff;
      }
      else if ((session->goaway_flags & 8) == 0) {
        session_local._4_4_ = 0;
      }
      else {
        session_local._4_4_ = -0x204;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int session_predicate_push_promise_send(nghttp2_session *session,
                                               nghttp2_stream *stream) {
  int rv;

  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }

  rv = session_predicate_for_stream_send(session, stream);
  if (rv != 0) {
    return rv;
  }

  assert(stream);

  if (session->remote_settings.enable_push == 0) {
    return NGHTTP2_ERR_PUSH_DISABLED;
  }
  if (stream->state == NGHTTP2_STREAM_CLOSING) {
    return NGHTTP2_ERR_STREAM_CLOSING;
  }
  if (session->goaway_flags & NGHTTP2_GOAWAY_RECV) {
    return NGHTTP2_ERR_START_STREAM_NOT_ALLOWED;
  }
  return 0;
}